

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<11264U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
uintwide_t(uintwide_t<11264U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
          char *str_input)

{
  size_type sVar1;
  pointer pvVar2;
  bool bVar3;
  allocator_type local_29;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_28;
  
  local_28._vptr_dynamic_array._0_4_ = 0;
  detail::fixed_dynamic_array<unsigned_int,_352U,_std::allocator<unsigned_int>_>::
  fixed_dynamic_array((fixed_dynamic_array<unsigned_int,_352U,_std::allocator<unsigned_int>_> *)this
                      ,0x160,(value_type *)&local_28,&local_29);
  bVar3 = rd_string(this,str_input,0xffffffffffffffff,0);
  if (!bVar3) {
    limits_helper_max<false>();
    sVar1 = (this->values).
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
            elem_count;
    (this->values).
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
         local_28.elem_count;
    pvVar2 = (this->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    (this->values).
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
         local_28.elems;
    local_28.elem_count = sVar1;
    local_28.elems = pvVar2;
    util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
    ~dynamic_array(&local_28);
  }
  return;
}

Assistant:

constexpr uintwide_t(const char* str_input) // NOLINT(google-explicit-constructor,hicpp-explicit-conversions)
      : values
        {
          static_cast<typename representation_type::size_type>(number_of_limbs),
          static_cast<typename representation_type::value_type>(UINT8_C(0)),
          typename representation_type::allocator_type()
        }
    {
      if(!rd_string(str_input, (std::numeric_limits<unsigned_fast_type>::max)(), 0))
      {
        static_cast<void>(operator=((std::numeric_limits<uintwide_t>::max)()));
      }
    }